

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

void __thiscall google::protobuf::UnknownFieldSet::ClearFallback(UnknownFieldSet *this)

{
  pointer pUVar1;
  LogMessage *other;
  long lVar2;
  long lVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x3d);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !fields_.empty(): ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  lVar2 = (long)(int)((ulong)((long)(this->fields_).
                                    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->fields_).
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
  lVar3 = lVar2 + 1;
  lVar2 = lVar2 << 4;
  do {
    UnknownField::Delete
              ((UnknownField *)
               ((long)&(this->fields_).
                       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].number_ + lVar2));
    lVar3 = lVar3 + -1;
    lVar2 = lVar2 + -0x10;
  } while (1 < lVar3);
  pUVar1 = (this->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish != pUVar1) {
    (this->fields_).
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = pUVar1;
  }
  return;
}

Assistant:

void UnknownFieldSet::ClearFallback() {
  GOOGLE_DCHECK(!fields_.empty());
  int n = fields_.size();
  do {
    (fields_)[--n].Delete();
  } while (n > 0);
  fields_.clear();
}